

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ubjson_encoder.hpp
# Opt level: O0

void __thiscall
jsoncons::ubjson::basic_ubjson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::
put_length(basic_ubjson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *this,
          size_t length)

{
  error_code ec;
  byte bVar1;
  short sVar2;
  int iVar3;
  ser_error *psVar4;
  undefined8 uVar5;
  ser_error *in_RSI;
  binary_stream_sink *in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffff68;
  ubjson_errc __e;
  binary_stream_sink *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff7c;
  uchar val_00;
  unsigned_short val;
  back_insert_iterator<jsoncons::binary_stream_sink> in_stack_ffffffffffffff80;
  ser_error *this_00;
  undefined4 in_stack_ffffffffffffff88;
  undefined2 in_stack_ffffffffffffff8c;
  undefined2 in_stack_ffffffffffffff8e;
  back_insert_iterator<jsoncons::binary_stream_sink> d_first;
  
  __e = (ubjson_errc)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  bVar1 = std::numeric_limits<unsigned_char>::max();
  val = (unsigned_short)((uint)in_stack_ffffffffffffff7c >> 0x10);
  if ((ser_error *)(ulong)bVar1 < in_RSI) {
    d_first.container = (binary_stream_sink *)in_RSI;
    sVar2 = std::numeric_limits<short>::max();
    if ((ser_error *)(long)sVar2 < d_first.container) {
      this_00 = in_RSI;
      iVar3 = std::numeric_limits<int>::max();
      if ((ser_error *)(long)iVar3 < this_00) {
        psVar4 = (ser_error *)std::numeric_limits<long>::max();
        if (psVar4 < in_RSI) {
          uVar5 = __cxa_allocate_exception(0x58);
          std::error_code::error_code<jsoncons::ubjson::ubjson_errc,void>((error_code *)in_RSI,__e);
          ec._4_2_ = in_stack_ffffffffffffff8c;
          ec._M_value = in_stack_ffffffffffffff88;
          ec._6_2_ = in_stack_ffffffffffffff8e;
          ec._M_cat = (error_category *)d_first.container;
          ser_error::ser_error(this_00,ec);
          __cxa_throw(uVar5,&ser_error::typeinfo,ser_error::~ser_error);
        }
        binary_stream_sink::push_back((binary_stream_sink *)in_RSI,(uint8_t)(__e >> 0x18));
        std::back_inserter<jsoncons::binary_stream_sink>(in_stack_ffffffffffffff58);
        binary::
        native_to_big<unsigned_long,std::back_insert_iterator<jsoncons::binary_stream_sink>,jsoncons::detail::endian>
                  (CONCAT26(in_stack_ffffffffffffff8e,
                            CONCAT24(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88)),d_first);
      }
      else {
        binary_stream_sink::push_back(in_stack_ffffffffffffff70,(uint8_t)(__e >> 0x18));
        std::back_inserter<jsoncons::binary_stream_sink>(in_stack_ffffffffffffff58);
        binary::
        native_to_big<unsigned_int,std::back_insert_iterator<jsoncons::binary_stream_sink>,jsoncons::detail::endian>
                  (CONCAT22(in_stack_ffffffffffffff8e,in_stack_ffffffffffffff8c),d_first);
      }
    }
    else {
      binary_stream_sink::push_back(in_stack_ffffffffffffff70,(uint8_t)(__e >> 0x18));
      std::back_inserter<jsoncons::binary_stream_sink>(in_stack_ffffffffffffff58);
      binary::
      native_to_big<unsigned_short,std::back_insert_iterator<jsoncons::binary_stream_sink>,jsoncons::detail::endian>
                (val,in_stack_ffffffffffffff80);
    }
  }
  else {
    binary_stream_sink::push_back(in_stack_ffffffffffffff70,(uint8_t)(__e >> 0x18));
    val_00 = (uchar)((uint)in_stack_ffffffffffffff7c >> 0x18);
    std::back_inserter<jsoncons::binary_stream_sink>(in_stack_ffffffffffffff58);
    binary::
    native_to_big<unsigned_char,std::back_insert_iterator<jsoncons::binary_stream_sink>,jsoncons::detail::endian>
              (val_00,in_stack_ffffffffffffff80);
  }
  return;
}

Assistant:

void put_length(std::size_t length)
    {
        if (length <= (std::numeric_limits<uint8_t>::max)())
        {
            sink_.push_back(ubjson_type::uint8_type);
            binary::native_to_big(static_cast<uint8_t>(length), std::back_inserter(sink_));
        }
        else if (length <= (std::size_t)(std::numeric_limits<int16_t>::max)())
        {
            sink_.push_back(ubjson_type::int16_type);
            binary::native_to_big(static_cast<uint16_t>(length), std::back_inserter(sink_));
        }
        else if (length <= (std::size_t)(std::numeric_limits<int32_t>::max)())
        {
            sink_.push_back(ubjson_type::int32_type);
            binary::native_to_big(static_cast<uint32_t>(length),std::back_inserter(sink_));
        }
        else if (length <= (std::size_t)(std::numeric_limits<int64_t>::max)())
        {
            sink_.push_back(ubjson_type::int64_type);
            binary::native_to_big(static_cast<uint64_t>(length),std::back_inserter(sink_));
        }
        else
        {
            JSONCONS_THROW(ser_error(ubjson_errc::too_many_items));
        }
    }